

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddDeferredStubs
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,
          DeferredFunctionStub *deferredStubs,uint stubsCount,ByteCodeCache *cache,bool recursive)

{
  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  DeferredFunctionStub *value;
  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  **ppBVar6;
  Recycler *pRVar7;
  int *ptr;
  Ident **ppIVar8;
  LPCOLESTR sz;
  int **ppiVar9;
  DeferredFunctionStub **ppDVar10;
  int capturedNameSerializedId;
  IdentPtr *pid;
  uint j;
  TrackAllocData local_a0;
  undefined1 local_78 [8];
  EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  uint capturedNamesCount;
  IdentPtrSet *capturedNames;
  DeferredFunctionStub *currentStub;
  uint i;
  bool recursive_local;
  ByteCodeCache *cache_local;
  uint stubsCount_local;
  DeferredFunctionStub *deferredStubs_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  if ((deferredStubs == (DeferredFunctionStub *)0x0) && (stubsCount != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xa0c,"(!(deferredStubs == nullptr && stubsCount > 0))",
                                "!(deferredStubs == nullptr && stubsCount > 0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((deferredStubs != (DeferredFunctionStub *)0x0) && (stubsCount != 0)) {
    for (currentStub._0_4_ = 0; (uint)currentStub < stubsCount;
        currentStub._0_4_ = (uint)currentStub + 1) {
      value = deferredStubs + (uint)currentStub;
      PrependInt32(this,builder,L"Character Min",value->ichMin,(BufferBuilderInt32 **)0x0);
      PrependInt32(this,builder,L"Function flags",value->fncFlags,(BufferBuilderInt32 **)0x0);
      PrependStruct<RestorePoint>(this,builder,L"Restore Point",&value->restorePoint);
      ppBVar6 = Memory::WriteBarrierPtr::operator_cast_to_BaseHashSet__
                          ((WriteBarrierPtr *)&value->capturedNamePointers);
      this_00 = *ppBVar6;
      if ((this_00 ==
           (BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)0x0) ||
         (iVar3 = JsUtil::
                  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Count(this_00), iVar3 == 0)) {
        PrependInt32(this,builder,L"Captured Name Count",0,(BufferBuilderInt32 **)0x0);
      }
      else {
        iter.
        super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
        ._28_4_ = JsUtil::
                  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Count(this_00);
        JsUtil::
        BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::GetIterator((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_78,this_00);
        PrependInt32(this,builder,L"Captured Name Count",
                     iter.
                     super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                     ._28_4_,(BufferBuilderInt32 **)0x0);
        if (cache != (ByteCodeCache *)0x0) {
          value->capturedNameCount =
               iter.
               super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
               ._28_4_;
          pRVar7 = ScriptContext::GetRecycler(this->scriptContext);
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_a0,(type_info *)&int::typeinfo,0,
                     (ulong)(uint)iter.
                                  super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                  ._28_4_,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                     ,0xa28);
          pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_a0);
          ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                          ((Memory *)pRVar7,(Recycler *)Memory::Recycler::Alloc,0,
                           (ulong)(uint)iter.
                                        super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                        ._28_4_);
          Memory::WriteBarrierPtr<int>::operator=(&value->capturedNameSerializedIds,ptr);
          Memory::WriteBarrierPtr<Js::ByteCodeCache>::operator=(&value->byteCodeCache,cache);
        }
        pid._4_4_ = 0;
        while (bVar2 = JsUtil::
                       BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ::
                       EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       ::IsValid((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                                  *)local_78), bVar2) {
          ppIVar8 = JsUtil::
                    BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::
                    IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                    ::CurrentValueReference
                              ((IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                *)local_78);
          sz = Ident::Psz(*ppIVar8);
          uVar4 = Ident::Cch(*ppIVar8);
          iVar3 = GetIdOfString(this,sz,(uVar4 + 1) * 2);
          if (cache != (ByteCodeCache *)0x0) {
            if ((uint)iter.
                      super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                      ._28_4_ <= pid._4_4_) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                          ,0xa37,"(j < capturedNamesCount)","j < capturedNamesCount"
                                         );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            ppiVar9 = Memory::WriteBarrierPtr::operator_cast_to_int__
                                ((WriteBarrierPtr *)&value->capturedNameSerializedIds);
            (*ppiVar9)[pid._4_4_] = iVar3;
          }
          PrependInt32(this,builder,L"Captured Name",iVar3,(BufferBuilderInt32 **)0x0);
          JsUtil::
          BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                      *)local_78);
          pid._4_4_ = pid._4_4_ + 1;
        }
      }
      PrependInt32(this,builder,L"Nested Count",value->nestedCount,(BufferBuilderInt32 **)0x0);
      if (recursive) {
        ppDVar10 = Memory::WriteBarrierPtr::operator_cast_to_DeferredFunctionStub__
                             ((WriteBarrierPtr *)&value->deferredStubs);
        AddDeferredStubs(this,builder,*ppDVar10,value->nestedCount,cache,recursive);
      }
    }
  }
  return 0;
}

Assistant:

HRESULT AddDeferredStubs(BufferBuilderList & builder, DeferredFunctionStub* deferredStubs, uint stubsCount, ByteCodeCache* cache, bool recursive)
    {
        AssertOrFailFast(!(deferredStubs == nullptr && stubsCount > 0));

        if (deferredStubs == nullptr || stubsCount == 0)
        {
            return S_OK;
        }

        for (uint i = 0; i < stubsCount; i++)
        {
            DeferredFunctionStub* currentStub = deferredStubs + i;

            PrependUInt32(builder, _u("Character Min"), currentStub->ichMin);
            PrependUInt32(builder, _u("Function flags"), currentStub->fncFlags);
            PrependStruct(builder, _u("Restore Point"), &(currentStub->restorePoint));

            // Add all the captured name ids
            IdentPtrSet *capturedNames = currentStub->capturedNamePointers;

            if (capturedNames != nullptr && capturedNames->Count() != 0)
            {
                uint capturedNamesCount = capturedNames->Count();
                auto iter = capturedNames->GetIterator();

                PrependUInt32(builder, _u("Captured Name Count"), capturedNamesCount);

                if (cache != nullptr)
                {
                    currentStub->capturedNameCount = capturedNamesCount;
                    currentStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, capturedNamesCount);
                    currentStub->byteCodeCache = cache;
                }

                uint j = 0;
                while (iter.IsValid())
                {
                    // The captured names are IdentPtr allocated in Parser arena memory.
                    // We have to convert them to indices into our string table to effectively
                    // serialize the names.
                    const IdentPtr& pid = iter.CurrentValueReference();
                    int capturedNameSerializedId = this->GetIdOfString(pid->Psz(), (pid->Cch() + 1) * sizeof(WCHAR));

                    if (cache != nullptr)
                    {
                        Assert(j < capturedNamesCount);
                        currentStub->capturedNameSerializedIds[j] = capturedNameSerializedId;
                    }

                    PrependInt32(builder, _u("Captured Name"), capturedNameSerializedId);

                    iter.MoveNext();
                    j++;
                }
            }
            else
            {
                PrependUInt32(builder, _u("Captured Name Count"), 0);
            }

            PrependUInt32(builder, _u("Nested Count"), currentStub->nestedCount);
            if (recursive)
            {
                AddDeferredStubs(builder, currentStub->deferredStubs, currentStub->nestedCount, cache, recursive);
            }
        }

        return S_OK;
    }